

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

string * __thiscall
t_java_generator::argument_list_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_struct *tstruct,
          bool include_types)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  pointer pptVar4;
  long *local_80;
  long local_70;
  long lStack_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  t_java_generator *local_58;
  string local_50;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  local_58 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = true;
    do {
      if (bVar3) {
        bVar3 = false;
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (include_types) {
        type_name_abi_cxx11_(&local_50,local_58,(*pptVar4)->type_,false,false,false,false);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_80 = &local_70;
        plVar2 = plVar1 + 2;
        if ((long *)*plVar1 == plVar2) {
          local_70 = *plVar2;
          lStack_68 = plVar1[3];
        }
        else {
          local_70 = *plVar2;
          local_80 = (long *)*plVar1;
        }
        *plVar1 = (long)plVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80);
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)((*pptVar4)->name_)._M_dataplus._M_p);
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_java_generator::argument_list(t_struct* tstruct, bool include_types) {
  string result = "";

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      result += ", ";
    }
    if (include_types) {
      result += type_name((*f_iter)->get_type()) + " ";
    }
    result += (*f_iter)->get_name();
  }
  return result;
}